

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::utility::operator>>
          (basic_istream<char,_std::char_traits<char>_> *in,ignore_spaces_cl *param_2)

{
  int iVar1;
  int_type iVar2;
  ulong uVar3;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  int_type c;
  
  while( true ) {
    uVar3 = std::ios::good();
    if ((uVar3 & 1) == 0) {
      return in_RDI;
    }
    iVar1 = std::istream::peek();
    iVar2 = std::char_traits<char>::eof();
    if (iVar1 == iVar2) break;
    if (((iVar1 != 0x20) && (iVar1 != 9)) && (iVar1 != 10)) {
      return in_RDI;
    }
    std::istream::get();
  }
  return in_RDI;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, const ignore_spaces_cl &) {
        while (in.good()) {
          const auto c{in.peek()};
          if (c == traits_t::eof() or not(c == ' ' or c == '\t' or c == '\n'))
            break;
          in.get();
        }
        return in;
      }